

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O0

bool __thiscall axl::zip::ZipReader::openFile(ZipReader *this,StringRef *fileName)

{
  bool bVar1;
  mz_bool mVar2;
  mz_zip_archive_tag *pmVar3;
  int in_ESI;
  ZipReader *in_RDI;
  mz_bool result;
  ZeroInit_t *in_stack_ffffffffffffff88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff90;
  mz_uint32 in_stack_ffffffffffffff9c;
  uint_t in_stack_ffffffffffffffbc;
  uint7 in_stack_ffffffffffffffc0;
  byte bVar4;
  
  close(in_RDI,in_ESI);
  pmVar3 = (mz_zip_archive_tag *)
           operator_new((size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->m_zip = pmVar3;
  pmVar3 = in_RDI->m_zip;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_stack_ffffffffffffff90);
  mVar2 = mz_zip_reader_init_file(pmVar3,(char *)in_RDI,in_stack_ffffffffffffff9c);
  bVar4 = 0;
  if (mVar2 == 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    bVar4 = 1;
    bVar1 = err::fail((ErrorRef *)0x1696ba);
  }
  else {
    bVar1 = true;
  }
  if ((bVar4 & 1) != 0) {
    err::ErrorRef::~ErrorRef((ErrorRef *)0x1696e7);
  }
  return bVar1;
}

Assistant:

bool
ZipReader::openFile(const sl::StringRef& fileName) {
	close();

	m_zip = new (mem::ZeroInit) mz_zip_archive;
	mz_bool result = mz_zip_reader_init_file(m_zip, fileName.sz(), MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY);
	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}